

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O1

void __thiscall wasm::InstrumentLocals::visitLocalGet(InstrumentLocals *this,LocalGet *curr)

{
  Type *this_00;
  Index x;
  uintptr_t uVar1;
  bool bVar2;
  HeapType HVar3;
  undefined8 *puVar4;
  Expression *expression;
  char *__assertion;
  MixedArena *this_01;
  initializer_list<wasm::Expression_*> __l;
  Const *local_80;
  Const *local_78;
  LocalGet *local_70;
  Builder local_68;
  Builder builder;
  pointer local_50;
  allocator_type local_41;
  undefined8 local_40;
  uintptr_t local_38;
  
  local_68.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
       ).super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>.
       super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>.currModule
  ;
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type;
  bVar2 = wasm::Type::isRef(this_00);
  if (bVar2) {
    HVar3 = wasm::Type::getHeapType(this_00);
    if (HVar3.id == 0) {
      bVar2 = wasm::Type::isNullable(this_00);
      if (!bVar2) goto LAB_007677ca;
      puVar4 = &get_externref;
    }
    else {
      if ((HVar3.id != 1) || (bVar2 = wasm::Type::isNullable(this_00), !bVar2)) {
LAB_007677ca:
        handle_unreachable("TODO: general reference types",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                           ,0x51);
      }
      puVar4 = &get_funcref;
    }
    goto LAB_00767699;
  }
  bVar2 = wasm::Type::isTuple(this_00);
  if (bVar2) {
    __assertion = "!curr->type.isTuple() && \"Unexpected tuple type\"";
LAB_007677f2:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                  ,0x54,"void wasm::InstrumentLocals::visitLocalGet(LocalGet *)");
  }
  if (6 < this_00->id) {
    __assertion = "curr->type.isBasic() && \"TODO: handle compound types\"";
    goto LAB_007677f2;
  }
  switch(this_00->id & 0xffffffff) {
  case 0:
  case 1:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                       ,0x66);
  case 2:
    puVar4 = &get_i32;
    break;
  case 3:
    goto switchD_0076766e_caseD_3;
  case 4:
    puVar4 = &get_f32;
    break;
  case 5:
    puVar4 = &get_f64;
    break;
  case 6:
    puVar4 = &get_v128;
    break;
  default:
    local_38 = 0;
    local_40 = 0;
    goto LAB_007676a8;
  }
LAB_00767699:
  local_40 = *puVar4;
  local_38 = puVar4[1];
LAB_007676a8:
  x = this->id;
  this->id = x + 1;
  local_80 = Builder::makeConst<int>(&local_68,x);
  local_78 = Builder::makeConst<int>(&local_68,curr->index);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_80;
  local_70 = curr;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,__l,
             &local_41);
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id;
  this_01 = &(local_68.wasm)->allocator;
  expression = (Expression *)MixedArena::allocSpace(this_01,0x48,8);
  expression->_id = CallId;
  (expression->type).id = 0;
  *(undefined8 *)(expression + 1) = 0;
  expression[1].type.id = 0;
  *(undefined8 *)(expression + 2) = 0;
  expression[2].type.id = (uintptr_t)this_01;
  *(undefined8 *)(expression + 3) = 0;
  expression[3].type.id = 0;
  *(undefined1 *)&expression[4]._id = InvalidId;
  (expression->type).id = uVar1;
  *(undefined8 *)(expression + 3) = local_40;
  expression[3].type.id = local_38;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(expression + 1),
             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
  *(undefined1 *)&expression[4]._id = InvalidId;
  Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
              ).
              super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>
              .super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>,
             expression);
  if (builder.wasm != (Module *)0x0) {
    operator_delete(builder.wasm,(long)local_50 - (long)builder.wasm);
  }
switchD_0076766e_caseD_3:
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    Builder builder(*getModule());
    Name import;
    if (curr->type.isRef()) {
      auto heapType = curr->type.getHeapType();
      if (heapType == HeapType::func && curr->type.isNullable()) {
        import = get_funcref;
      } else if (heapType == HeapType::ext && curr->type.isNullable()) {
        import = get_externref;
      } else {
        WASM_UNREACHABLE("TODO: general reference types");
      }
    } else {
      TODO_SINGLE_COMPOUND(curr->type);
      switch (curr->type.getBasic()) {
        case Type::i32:
          import = get_i32;
          break;
        case Type::i64:
          return; // TODO
        case Type::f32:
          import = get_f32;
          break;
        case Type::f64:
          import = get_f64;
          break;
        case Type::v128:
          import = get_v128;
          break;
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
    }
    replaceCurrent(builder.makeCall(import,
                                    {builder.makeConst(int32_t(id++)),
                                     builder.makeConst(int32_t(curr->index)),
                                     curr},
                                    curr->type));
  }